

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2LoadImm12(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  DecodeStatus DVar7;
  uint64_t uVar8;
  uint64_t in_RCX;
  undefined8 in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  byte bVar9;
  byte bVar10;
  _Bool hasV7Ops;
  _Bool hasMP;
  uint64_t featureBits;
  uint imm;
  uint Rt;
  uint Rn;
  DecodeStatus S;
  uint in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  uint RegNo;
  undefined4 in_stack_ffffffffffffffe8;
  DecodeStatus local_4;
  
  uVar6 = (uint)((ulong)in_RDX >> 0x20);
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0x10,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0xc,4);
  uVar4 = fieldFromInstruction_4(in_ESI,0,0xc);
  uVar8 = ARM_getFeatureBits(in_RDI->csh->mode);
  bVar9 = (uVar8 & 0x8000) != 0;
  bVar10 = (uVar8 & 0x10000000000) != 0;
  uVar5 = uVar2 << 0xd | uVar4;
  if (uVar2 == 0xf) {
    uVar5 = MCInst_getOpcode(in_RDI);
    if (uVar5 == 0x94d) {
      MCInst_setOpcode(in_RDI,0x94f);
    }
    else if (uVar5 == 0x95c) {
      MCInst_setOpcode(in_RDI,0x95e);
    }
    else if (uVar5 == 0x964) {
      MCInst_setOpcode(in_RDI,0x966);
    }
    else if (uVar5 == 0x96c) {
      MCInst_setOpcode(in_RDI,0x96e);
    }
    else if (uVar5 == 0x974) {
      MCInst_setOpcode(in_RDI,0x976);
    }
    else if (uVar5 == 0x9b7) {
      MCInst_setOpcode(in_RDI,0x9b9);
    }
    else {
      if (uVar5 != 0x9bb) {
        return MCDisassembler_Fail;
      }
      MCInst_setOpcode(in_RDI,0x9bd);
    }
    local_4 = DecodeT2LoadLabel((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),uVar6,in_RCX,
                                (void *)CONCAT44(local_4,uVar2));
  }
  else {
    if (uVar3 == 0xf) {
      in_stack_ffffffffffffffb4 = MCInst_getOpcode(in_RDI);
      if (in_stack_ffffffffffffffb4 == 0x95c) {
        MCInst_setOpcode(in_RDI,0x9b4);
      }
      else if (in_stack_ffffffffffffffb4 == 0x964) {
        MCInst_setOpcode(in_RDI,0x9bb);
      }
      else if (in_stack_ffffffffffffffb4 == 0x96c) {
        return MCDisassembler_Fail;
      }
    }
    RegNo = (uint)(uVar8 >> 0x20);
    uVar6 = MCInst_getOpcode(in_RDI);
    if (uVar6 == 0x9b4) {
      if (((bVar10 & 1) == 0) || ((bVar9 & 1) == 0)) {
        return MCDisassembler_Fail;
      }
    }
    else if (uVar6 != 0x9b7) {
      if (uVar6 == 0x9bb) {
        if ((bVar10 & 1) == 0) {
          return MCDisassembler_Fail;
        }
      }
      else {
        DVar7 = DecodeGPRRegisterClass
                          ((MCInst *)CONCAT44(uVar3,uVar5),RegNo,
                           CONCAT17(bVar9,CONCAT16(bVar10,CONCAT24(in_stack_ffffffffffffffbc,
                                                                   in_stack_ffffffffffffffb8))),
                           (void *)CONCAT44(in_stack_ffffffffffffffb4,uVar6));
        _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar7);
        if (!_Var1) {
          return MCDisassembler_Fail;
        }
      }
    }
    DVar7 = DecodeT2AddrModeImm12
                      ((MCInst *)CONCAT44(uVar3,uVar5),RegNo,
                       CONCAT17(bVar9,CONCAT16(bVar10,CONCAT24(in_stack_ffffffffffffffbc,
                                                               in_stack_ffffffffffffffb8))),
                       (void *)CONCAT44(in_stack_ffffffffffffffb4,uVar6));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar7);
    if (!_Var1) {
      local_4 = MCDisassembler_Fail;
    }
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeT2LoadImm12(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void* Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 12);
	uint64_t featureBits = ARM_getFeatureBits(Inst->csh->mode);
	bool hasMP = ((featureBits & ARM_FeatureMP) != 0);
	bool hasV7Ops = ((featureBits & ARM_HasV7Ops) != 0);

	imm |= (Rn << 13);

	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRi12:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2LDRHi12:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSHi12:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			case ARM_t2LDRBi12:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRSBi12:
				MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2PLDi12:
				MCInst_setOpcode(Inst, ARM_t2PLDpci);
				break;
			case ARM_t2PLIi12:
				MCInst_setOpcode(Inst, ARM_t2PLIpci);
				break;
			default:
				return MCDisassembler_Fail;
		}
		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (Rt == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRSHi12:
				return MCDisassembler_Fail;
			case ARM_t2LDRHi12:
				MCInst_setOpcode(Inst, ARM_t2PLDWi12);
				break;
			case ARM_t2LDRSBi12:
				MCInst_setOpcode(Inst, ARM_t2PLIi12);
				break;
			default:
				break;
		}
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2PLDi12:
			break;
		case ARM_t2PLIi12:
			if (!hasV7Ops)
				return MCDisassembler_Fail;
			break;
		case ARM_t2PLDWi12:
			if (!hasV7Ops || !hasMP)
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeT2AddrModeImm12(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	return S;
}